

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushStyleVar(ImGuiStyleVar idx,float val)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ImGuiStyleMod *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiStyleMod *__dest;
  int iVar6;
  int iVar7;
  
  pIVar5 = GImGui;
  if (0x14 < (uint)idx) {
    __assert_fail("idx >= 0 && idx < ImGuiStyleVar_COUNT",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x1a90,"const ImGuiStyleVarInfo *GetStyleVarInfo(ImGuiStyleVar)");
  }
  if ((GStyleVarInfo[(uint)idx].Type == 4) && (GStyleVarInfo[(uint)idx].Count == 1)) {
    uVar2 = GStyleVarInfo[(uint)idx].Offset;
    iVar1 = *(int *)((long)&(GImGui->Style).Alpha + (ulong)uVar2);
    iVar7 = (GImGui->StyleModifiers).Size;
    iVar3 = (GImGui->StyleModifiers).Capacity;
    if (iVar7 == iVar3) {
      iVar7 = iVar7 + 1;
      if (iVar3 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar3 / 2 + iVar3;
      }
      if (iVar7 < iVar6) {
        iVar7 = iVar6;
      }
      if (iVar3 < iVar7) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
        __dest = (ImGuiStyleMod *)(*GImAllocatorAllocFunc)((long)iVar7 * 0xc,GImAllocatorUserData);
        pIVar4 = (pIVar5->StyleModifiers).Data;
        if (pIVar4 != (ImGuiStyleMod *)0x0) {
          memcpy(__dest,pIVar4,(long)(pIVar5->StyleModifiers).Size * 0xc);
          pIVar4 = (pIVar5->StyleModifiers).Data;
          if (pIVar4 != (ImGuiStyleMod *)0x0) {
            GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
          }
          (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
        }
        (pIVar5->StyleModifiers).Data = __dest;
        (pIVar5->StyleModifiers).Capacity = iVar7;
      }
    }
    pIVar4 = (pIVar5->StyleModifiers).Data;
    iVar7 = (pIVar5->StyleModifiers).Size;
    pIVar4[iVar7].VarIdx = idx;
    pIVar4[iVar7].field_1.BackupInt[0] = iVar1;
    (pIVar5->StyleModifiers).Size = (pIVar5->StyleModifiers).Size + 1;
    *(float *)((long)&(pIVar5->Style).Alpha + (ulong)uVar2) = val;
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                ,0x1aa0,"void ImGui::PushStyleVar(ImGuiStyleVar, float)");
}

Assistant:

static const ImGuiStyleVarInfo* GetStyleVarInfo(ImGuiStyleVar idx)
{
    IM_ASSERT(idx >= 0 && idx < ImGuiStyleVar_COUNT);
    IM_ASSERT(IM_ARRAYSIZE(GStyleVarInfo) == ImGuiStyleVar_COUNT);
    return &GStyleVarInfo[idx];
}